

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS ref_recon_ghost_cloud(REF_CLOUD *one_layer,REF_NODE ref_node)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar2;
  REF_INT *pRVar3;
  REF_CLOUD pRVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int *__s;
  REF_INT *send_size;
  long lVar8;
  REF_INT *recv_size;
  void *pvVar9;
  long lVar10;
  undefined8 uVar11;
  REF_DBL *pRVar12;
  REF_STATUS RVar13;
  ulong uVar14;
  char *pcVar15;
  int iVar16;
  size_t sVar17;
  int *piVar18;
  long lVar19;
  REF_INT local;
  uint local_c8;
  int local_bc;
  void *local_b8;
  REF_INT *local_b0;
  int *local_a8;
  ulong local_a0;
  void *local_98;
  void *local_90;
  REF_INT *local_88;
  void *local_80;
  ulong local_78;
  void *local_70;
  REF_DBL *local_68;
  void *local_60;
  REF_CLOUD *local_58;
  int *local_50;
  void *local_48;
  ulong local_40;
  REF_INT *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  sVar17 = (long)ref_mpi->n << 2;
  __s = (int *)malloc(sVar17);
  if (__s == (int *)0x0) {
    piVar18 = (int *)0x0;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x321,
           "ref_recon_ghost_cloud","malloc a_next of REF_INT NULL");
  }
  else {
    memset(__s,0,sVar17);
    piVar18 = __s;
  }
  RVar13 = 2;
  if (__s == (int *)0x0) {
    return 2;
  }
  iVar7 = ref_mpi->n;
  local_58 = one_layer;
  local_50 = piVar18;
  if ((long)iVar7 < 0) {
    bVar5 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x322,
           "ref_recon_ghost_cloud","malloc b_next of REF_INT negative");
    local_c8 = 1;
  }
  else {
    sVar17 = (long)iVar7 * 4;
    local_a8 = (int *)malloc(sVar17);
    if (local_a8 == (int *)0x0) {
      local_a8 = (int *)0x0;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x322
             ,"ref_recon_ghost_cloud","malloc b_next of REF_INT NULL");
      local_c8 = 2;
      bVar5 = false;
    }
    else {
      bVar5 = true;
      if (iVar7 != 0) {
        memset(local_a8,0,sVar17);
      }
      local_c8 = 2;
    }
  }
  if (!bVar5) {
    return local_c8;
  }
  if ((long)ref_mpi->n < 0) {
    local_c8 = 1;
    pcVar15 = "malloc a_nnode of REF_INT negative";
LAB_001bc016:
    bVar5 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x323,
           "ref_recon_ghost_cloud",pcVar15);
    send_size = (REF_INT *)0x0;
  }
  else {
    send_size = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (send_size == (REF_INT *)0x0) {
      local_c8 = 2;
      pcVar15 = "malloc a_nnode of REF_INT NULL";
      goto LAB_001bc016;
    }
    bVar5 = true;
    if (0 < ref_mpi->n) {
      lVar8 = 0;
      do {
        send_size[lVar8] = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 < ref_mpi->n);
    }
  }
  if (!bVar5) {
    return local_c8;
  }
  if ((long)ref_mpi->n < 0) {
    local_c8 = 1;
    pcVar15 = "malloc b_nnode of REF_INT negative";
LAB_001bc0a7:
    bVar5 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x324,
           "ref_recon_ghost_cloud",pcVar15);
    recv_size = (REF_INT *)0x0;
  }
  else {
    recv_size = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (recv_size == (REF_INT *)0x0) {
      local_c8 = 2;
      pcVar15 = "malloc b_nnode of REF_INT NULL";
      goto LAB_001bc0a7;
    }
    bVar5 = true;
    if (0 < ref_mpi->n) {
      lVar8 = 0;
      do {
        recv_size[lVar8] = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 < ref_mpi->n);
    }
  }
  if (!bVar5) {
    return local_c8;
  }
  if ((long)ref_mpi->n < 0) {
    local_c8 = 1;
    pcVar15 = "malloc a_ncloud of REF_INT negative";
LAB_001bc12b:
    bVar5 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x325,
           "ref_recon_ghost_cloud",pcVar15);
    local_88 = (REF_INT *)0x0;
  }
  else {
    local_88 = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (local_88 == (REF_INT *)0x0) {
      local_c8 = 2;
      pcVar15 = "malloc a_ncloud of REF_INT NULL";
      goto LAB_001bc12b;
    }
    bVar5 = true;
    if (0 < ref_mpi->n) {
      lVar8 = 0;
      do {
        local_88[lVar8] = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 < ref_mpi->n);
    }
  }
  if (!bVar5) {
    return local_c8;
  }
  if ((long)ref_mpi->n < 0) {
    local_c8 = 1;
    pcVar15 = "malloc b_ncloud of REF_INT negative";
LAB_001bc1b3:
    bVar5 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x326,
           "ref_recon_ghost_cloud",pcVar15);
    local_b0 = (REF_INT *)0x0;
  }
  else {
    local_b0 = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (local_b0 == (REF_INT *)0x0) {
      local_c8 = 2;
      pcVar15 = "malloc b_ncloud of REF_INT NULL";
      goto LAB_001bc1b3;
    }
    bVar5 = true;
    if (0 < ref_mpi->n) {
      lVar8 = 0;
      do {
        local_b0[lVar8] = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 < ref_mpi->n);
    }
  }
  if (!bVar5) {
    return local_c8;
  }
  iVar7 = ref_node->max;
  if (0 < (long)iVar7) {
    pRVar2 = ref_node->global;
    lVar8 = 0;
    do {
      if ((-1 < pRVar2[lVar8]) && (ref_mpi->id != ref_node->part[lVar8])) {
        send_size[ref_node->part[lVar8]] = send_size[ref_node->part[lVar8]] + 1;
      }
      lVar8 = lVar8 + 1;
    } while (iVar7 != lVar8);
  }
  uVar6 = ref_mpi_alltoall(ref_mpi,send_size,recv_size,1);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x330,
           "ref_recon_ghost_cloud",(ulong)uVar6,"alltoall nnodes");
    return uVar6;
  }
  iVar7 = ref_mpi->n;
  lVar8 = (long)iVar7;
  if (lVar8 < 1) {
    uVar6 = 0;
  }
  else {
    lVar10 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + send_size[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
  }
  if ((int)uVar6 < 0) {
    pcVar15 = "malloc a_global of REF_GLOB negative";
    uVar11 = 0x334;
LAB_001bc317:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar11,
           "ref_recon_ghost_cloud",pcVar15);
    RVar13 = 1;
  }
  else {
    local_70 = (void *)(ulong)uVar6;
    pvVar9 = malloc((long)local_70 * 8);
    if (pvVar9 == (void *)0x0) {
      pcVar15 = "malloc a_global of REF_GLOB NULL";
      uVar11 = 0x334;
    }
    else {
      local_48 = pvVar9;
      local_70 = malloc((long)local_70 << 2);
      if (local_70 == (void *)0x0) {
        pcVar15 = "malloc a_part of REF_INT NULL";
        uVar11 = 0x335;
      }
      else {
        if (iVar7 < 1) {
          pvVar9 = (void *)0x0;
        }
        else {
          lVar10 = 0;
          pvVar9 = (void *)0x0;
          do {
            pvVar9 = (void *)(ulong)(uint)((int)pvVar9 + recv_size[lVar10]);
            lVar10 = lVar10 + 1;
          } while (lVar8 != lVar10);
        }
        if ((int)pvVar9 < 0) {
          pcVar15 = "malloc b_global of REF_GLOB negative";
          uVar11 = 0x339;
          goto LAB_001bc317;
        }
        local_a0 = CONCAT44(local_a0._4_4_,(int)pvVar9);
        local_98 = pvVar9;
        local_90 = malloc((long)pvVar9 * 8);
        if (local_90 == (void *)0x0) {
          pcVar15 = "malloc b_global of REF_GLOB NULL";
          uVar11 = 0x339;
        }
        else {
          local_98 = malloc((long)local_98 << 2);
          pvVar9 = local_70;
          if (local_98 == (void *)0x0) {
            pcVar15 = "malloc b_part of REF_INT NULL";
            uVar11 = 0x33a;
          }
          else {
            *local_50 = 0;
            if (1 < iVar7) {
              iVar7 = *local_50;
              lVar10 = 0;
              do {
                iVar7 = iVar7 + send_size[lVar10];
                local_50[lVar10 + 1] = iVar7;
                lVar10 = lVar10 + 1;
              } while (lVar8 + -1 != lVar10);
            }
            iVar7 = ref_node->max;
            if (0 < (long)iVar7) {
              pRVar2 = ref_node->global;
              lVar8 = 0;
              do {
                if (-1 < pRVar2[lVar8]) {
                  iVar16 = ref_mpi->id;
                  pRVar3 = ref_node->part;
                  iVar1 = pRVar3[lVar8];
                  if (iVar16 != iVar1) {
                    iVar1 = local_50[iVar1];
                    *(REF_GLOB *)((long)local_48 + (long)iVar1 * 8) = pRVar2[lVar8];
                    *(int *)((long)local_70 + (long)iVar1 * 4) = iVar16;
                    local_50[pRVar3[lVar8]] = local_50[pRVar3[lVar8]] + 1;
                  }
                }
                lVar8 = lVar8 + 1;
              } while (iVar7 != lVar8);
            }
            uVar6 = ref_mpi_alltoallv(ref_mpi,local_48,send_size,local_90,recv_size,1,2);
            if (uVar6 != 0) {
              local_b8 = (void *)CONCAT44(local_b8._4_4_,uVar6);
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x34c,"ref_recon_ghost_cloud",(ulong)uVar6,"alltoallv global");
              local_c8 = (uint)local_b8;
              uVar6 = (uint)local_b8;
            }
            if (uVar6 != 0) {
              return local_c8;
            }
            local_38 = recv_size;
            uVar6 = ref_mpi_alltoallv(ref_mpi,pvVar9,send_size,local_98,recv_size,1,1);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x34f,"ref_recon_ghost_cloud",(ulong)uVar6,"alltoallv part");
              return uVar6;
            }
            if ((int)local_a0 != 0) {
              local_b8 = (void *)0x1;
              if (1 < (int)local_a0) {
                local_b8 = (void *)(local_a0 & 0xffffffff);
              }
              pvVar9 = (void *)0x0;
              do {
                uVar6 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_90 + (long)pvVar9 * 8),
                                       &local_bc);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x353,"ref_recon_ghost_cloud",(ulong)uVar6,"g2l");
                  return uVar6;
                }
                local_b0[*(int *)((long)local_98 + (long)pvVar9 * 4)] =
                     local_b0[*(int *)((long)local_98 + (long)pvVar9 * 4)] + local_58[local_bc]->n;
                pvVar9 = (void *)((long)pvVar9 + 1);
              } while (local_b8 != pvVar9);
            }
            uVar6 = ref_mpi_alltoall(ref_mpi,local_b0,local_88,1);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x35a,"ref_recon_ghost_cloud",(ulong)uVar6,"alltoall nclouds");
              return uVar6;
            }
            iVar7 = ref_mpi->n;
            lVar8 = (long)iVar7;
            if (lVar8 < 1) {
              local_78 = 0;
            }
            else {
              lVar10 = 0;
              local_78 = 0;
              do {
                local_78 = (ulong)(uint)((int)local_78 + local_88[lVar10]);
                lVar10 = lVar10 + 1;
              } while (lVar8 != lVar10);
            }
            if ((int)local_78 < 0) {
              pcVar15 = "malloc a_keyval of REF_GLOB negative";
              uVar11 = 0x35e;
              goto LAB_001bc317;
            }
            local_80 = malloc((ulong)(uint)((int)local_78 * 2) << 3);
            if (local_80 == (void *)0x0) {
              pcVar15 = "malloc a_keyval of REF_GLOB NULL";
              uVar11 = 0x35e;
            }
            else {
              local_68 = (REF_DBL *)malloc((ulong)(uint)((int)local_78 * 4) << 3);
              if (local_68 == (REF_DBL *)0x0) {
                pcVar15 = "malloc a_aux of REF_DBL NULL";
                uVar11 = 0x35f;
              }
              else {
                if (iVar7 < 1) {
                  iVar16 = 0;
                }
                else {
                  lVar10 = 0;
                  iVar16 = 0;
                  do {
                    iVar16 = iVar16 + local_b0[lVar10];
                    lVar10 = lVar10 + 1;
                  } while (lVar8 != lVar10);
                }
                if (iVar16 < 0) {
                  pcVar15 = "malloc b_keyval of REF_GLOB negative";
                  uVar11 = 0x363;
                  goto LAB_001bc317;
                }
                local_b8 = malloc((ulong)(uint)(iVar16 * 2) << 3);
                if (local_b8 == (void *)0x0) {
                  pcVar15 = "malloc b_keyval of REF_GLOB NULL";
                  uVar11 = 0x363;
                }
                else {
                  local_60 = malloc((ulong)(uint)(iVar16 << 2) << 3);
                  if (local_60 != (void *)0x0) {
                    *local_a8 = 0;
                    if (1 < iVar7) {
                      iVar7 = *local_a8;
                      lVar10 = 0;
                      do {
                        iVar7 = iVar7 + local_b0[lVar10];
                        local_a8[lVar10 + 1] = iVar7;
                        lVar10 = lVar10 + 1;
                      } while (lVar8 + -1 != lVar10);
                    }
                    if ((int)local_a0 != 0) {
                      local_40 = 1;
                      if (1 < (int)local_a0) {
                        local_40 = local_a0 & 0xffffffff;
                      }
                      uVar14 = 0;
                      do {
                        uVar6 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_90 + uVar14 * 8),
                                               &local_bc);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                 ,0x36c,"ref_recon_ghost_cloud",(ulong)uVar6,"g2l");
                          return uVar6;
                        }
                        pRVar4 = local_58[local_bc];
                        if (0 < pRVar4->n) {
                          local_a0 = (ulong)*(int *)((long)local_98 + uVar14 * 4);
                          uVar11 = *(undefined8 *)((long)local_90 + uVar14 * 8);
                          pRVar2 = pRVar4->global;
                          pRVar12 = pRVar4->aux;
                          iVar7 = pRVar4->naux;
                          lVar8 = (long)local_a8[local_a0];
                          iVar16 = pRVar4->n;
                          pvVar9 = (void *)(lVar8 * 0x20 + (long)local_60);
                          lVar10 = 0;
                          do {
                            *(undefined8 *)((long)local_b8 + lVar8 * 0x10) = uVar11;
                            *(REF_GLOB *)((long)local_b8 + lVar8 * 0x10 + 8) = pRVar2[lVar10];
                            lVar19 = 0;
                            do {
                              *(REF_DBL *)((long)pvVar9 + lVar19 * 8) = pRVar12[lVar19];
                              lVar19 = lVar19 + 1;
                            } while (lVar19 != 4);
                            lVar8 = lVar8 + 1;
                            lVar10 = lVar10 + 1;
                            pvVar9 = (void *)((long)pvVar9 + 0x20);
                            pRVar12 = pRVar12 + iVar7;
                          } while (lVar10 < iVar16);
                          local_a8[local_a0] = (int)lVar8;
                        }
                        uVar14 = uVar14 + 1;
                      } while (uVar14 != local_40);
                    }
                    uVar6 = ref_mpi_alltoallv(ref_mpi,local_b8,local_b0,local_80,local_88,2,2);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                             ,0x37d,"ref_recon_ghost_cloud",(ulong)uVar6,"alltoallv keyval");
                      return uVar6;
                    }
                    uVar6 = ref_mpi_alltoallv(ref_mpi,local_60,local_b0,local_68,local_88,4,3);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                             ,0x380,"ref_recon_ghost_cloud",(ulong)uVar6,"alltoallv aux");
                      return uVar6;
                    }
                    if ((int)local_78 != 0) {
                      uVar14 = 1;
                      if (1 < (int)local_78) {
                        uVar14 = local_78 & 0xffffffff;
                      }
                      lVar8 = 0;
                      pRVar12 = local_68;
                      do {
                        uVar6 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_80 + lVar8),
                                               &local_bc);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                 ,900,"ref_recon_ghost_cloud",(ulong)uVar6,"g2l");
                          return uVar6;
                        }
                        uVar6 = ref_cloud_store(local_58[local_bc],
                                                *(REF_GLOB *)((long)local_80 + lVar8 + 8),pRVar12);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                 ,0x388,"ref_recon_ghost_cloud",(ulong)uVar6,"add ghost");
                          return uVar6;
                        }
                        pRVar12 = pRVar12 + 4;
                        lVar8 = lVar8 + 0x10;
                      } while (uVar14 << 4 != lVar8);
                    }
                    free(local_60);
                    free(local_b8);
                    free(local_68);
                    free(local_80);
                    free(local_98);
                    free(local_90);
                    free(local_70);
                    free(local_48);
                    free(local_b0);
                    free(local_88);
                    free(local_38);
                    free(send_size);
                    free(local_a8);
                    free(local_50);
                    return 0;
                  }
                  pcVar15 = "malloc b_aux of REF_DBL NULL";
                  uVar11 = 0x364;
                  local_60 = (void *)0x0;
                }
              }
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar11,
           "ref_recon_ghost_cloud",pcVar15);
  }
  return RVar13;
}

Assistant:

REF_FCN REF_STATUS ref_recon_ghost_cloud(REF_CLOUD *one_layer,
                                         REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_CLOUD ref_cloud;
  REF_INT *a_nnode, *b_nnode;
  REF_INT a_nnode_total, b_nnode_total;
  REF_GLOB *a_global, *b_global;
  REF_INT *a_part, *b_part;
  REF_INT *a_ncloud, *b_ncloud;
  REF_INT a_ncloud_total, b_ncloud_total;
  REF_GLOB *a_keyval, *b_keyval;
  REF_DBL *a_aux, *b_aux;
  REF_INT part, node, degree;
  REF_INT *a_next, *b_next;
  REF_INT local, cloud, key_index, aux_index;
  REF_GLOB global;
  REF_INT nkeyval = 2, naux = 4;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_ncloud, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_ncloud, ref_mpi_n(ref_mpi), REF_INT, 0);

  /* ghost nodes need to fill */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      a_nnode[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_nnode, b_nnode, REF_INT_TYPE),
      "alltoall nnodes");

  a_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_nnode_total += a_nnode[part];
  ref_malloc(a_global, a_nnode_total, REF_GLOB);
  ref_malloc(a_part, a_nnode_total, REF_INT);

  b_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_nnode_total += b_nnode[part];
  ref_malloc(b_global, b_nnode_total, REF_GLOB);
  ref_malloc(b_part, b_nnode_total, REF_INT);

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_nnode[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_part[a_next[part]] = ref_mpi_rank(ref_mpi);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_nnode, b_global, b_nnode, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");
  RSS(ref_mpi_alltoallv(ref_mpi, a_part, a_nnode, b_part, b_nnode, 1,
                        REF_INT_TYPE),
      "alltoallv part");

  /* degree of these node cloud to send */
  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    degree = ref_cloud_n(one_layer[local]);
    b_ncloud[part] += degree;
  }

  RSS(ref_mpi_alltoall(ref_mpi, b_ncloud, a_ncloud, REF_INT_TYPE),
      "alltoall nclouds");

  a_ncloud_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_ncloud_total += a_ncloud[part];
  ref_malloc(a_keyval, nkeyval * a_ncloud_total, REF_GLOB);
  ref_malloc(a_aux, naux * a_ncloud_total, REF_DBL);

  b_ncloud_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_ncloud_total += b_ncloud[part];
  ref_malloc(b_keyval, nkeyval * b_ncloud_total, REF_GLOB);
  ref_malloc(b_aux, naux * b_ncloud_total, REF_DBL);

  b_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    b_next[part] = b_next[part - 1] + b_ncloud[part - 1];
  }

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    ref_cloud = one_layer[local];
    each_ref_cloud_item(ref_cloud, key_index) {
      b_keyval[0 + nkeyval * b_next[part]] = b_global[node];
      b_keyval[1 + nkeyval * b_next[part]] =
          ref_cloud_global(ref_cloud, key_index);
      for (aux_index = 0; aux_index < naux; aux_index++) {
        b_aux[aux_index + naux * b_next[part]] =
            ref_cloud_aux(ref_cloud, aux_index, key_index);
      }
      b_next[part]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_keyval, b_ncloud, a_keyval, a_ncloud,
                        nkeyval, REF_GLOB_TYPE),
      "alltoallv keyval");
  RSS(ref_mpi_alltoallv(ref_mpi, b_aux, b_ncloud, a_aux, a_ncloud, naux,
                        REF_DBL_TYPE),
      "alltoallv aux");

  for (cloud = 0; cloud < a_ncloud_total; cloud++) {
    global = a_keyval[0 + nkeyval * cloud];
    RSS(ref_node_local(ref_node, global, &local), "g2l");
    ref_cloud = one_layer[local];
    RSS(ref_cloud_store(ref_cloud, a_keyval[1 + nkeyval * cloud],
                        &(a_aux[naux * cloud])),
        "add ghost");
  }

  free(b_aux);
  free(b_keyval);
  free(a_aux);
  free(a_keyval);
  free(b_part);
  free(b_global);
  free(a_part);
  free(a_global);
  free(b_ncloud);
  free(a_ncloud);
  free(b_nnode);
  free(a_nnode);
  free(b_next);
  free(a_next);

  return REF_SUCCESS;
}